

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O3

int __thiscall
Vgm_Emu_Impl::play_frame(Vgm_Emu_Impl *this,blip_time_t blip_time,int sample_count,sample_t *buf)

{
  sample_t_conflict1 *psVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int end_time;
  
  lVar5 = (long)this->fm_time_factor;
  iVar2 = (int)(((long)(sample_count >> 1) << 0xc) / lVar5);
  end_time = iVar2 + -2;
  uVar3 = (iVar2 + -1) * lVar5 + this->fm_time_offset;
  do {
    uVar6 = uVar3 >> 0xc;
    end_time = end_time + 1;
    uVar3 = uVar3 + lVar5;
    iVar2 = (int)uVar6;
  } while (iVar2 < sample_count >> 1);
  if ((this->ym2612).last_time == -1) {
    if ((this->ym2413).last_time != -1) {
      (this->ym2413).out = buf;
      (this->ym2413).last_time = 0;
    }
  }
  else {
    (this->ym2612).out = buf;
    (this->ym2612).last_time = 0;
    memset(buf,0,(long)(iVar2 * 2) * 2);
  }
  run_commands(this,end_time);
  iVar4 = (this->ym2612).last_time;
  if ((-1 < iVar4) && (iVar4 = iVar2 - iVar4, 0 < iVar4)) {
    (this->ym2612).last_time = iVar2;
    psVar1 = (this->ym2612).out;
    (this->ym2612).out = psVar1 + (uint)(iVar4 * 2);
    Ym2612_Emu::run(&(this->ym2612).super_Ym2612_Emu,iVar4,psVar1);
  }
  iVar4 = (this->ym2413).last_time;
  if ((-1 < iVar4) && (iVar4 = iVar2 - iVar4, 0 < iVar4)) {
    (this->ym2413).last_time = iVar2;
    psVar1 = (this->ym2413).out;
    (this->ym2413).out = psVar1 + (uint)(iVar4 * 2);
    Ym2413_Emu::run(&(this->ym2413).super_Ym2413_Emu,iVar4,psVar1);
  }
  this->fm_time_offset =
       this->fm_time_offset + (long)iVar2 * -0x1000 + (long)end_time * (long)this->fm_time_factor;
  Sms_Apu::end_frame(&this->psg,blip_time);
  return iVar2 * 2;
}

Assistant:

int Vgm_Emu_Impl::play_frame( blip_time_t blip_time, int sample_count, sample_t* buf )
{
	// to do: timing is working mostly by luck
	
	int min_pairs = sample_count >> 1;
	int vgm_time = ((long) min_pairs << fm_time_bits) / fm_time_factor - 1;
	assert( to_fm_time( vgm_time ) <= min_pairs );
	int pairs = min_pairs;
	while ( (pairs = to_fm_time( vgm_time )) < min_pairs )
		vgm_time++;
	//debug_printf( "pairs: %d, min_pairs: %d\n", pairs, min_pairs );
	
	if ( ym2612.enabled() )
	{
		ym2612.begin_frame( buf );
		memset( buf, 0, pairs * stereo * sizeof *buf );
	}
	else if ( ym2413.enabled() )
	{
		ym2413.begin_frame( buf );
	}
	
	run_commands( vgm_time );
	ym2612.run_until( pairs );
	ym2413.run_until( pairs );
	
	fm_time_offset = (vgm_time * fm_time_factor + fm_time_offset) -
			((long) pairs << fm_time_bits);
	
	psg.end_frame( blip_time );
	
	return pairs * stereo;
}